

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void ra_rename(ASMState *as,Reg down,Reg up)

{
  uint uVar1;
  int iVar2;
  SnapNo SVar3;
  IRIns *pIVar4;
  jit_State *pjVar5;
  byte bVar6;
  TRef TVar7;
  ulong uVar8;
  
  uVar1 = as->cost[down];
  as->cost[up] = uVar1;
  pIVar4 = as->ir;
  uVar8 = (ulong)((uVar1 & 0xffff) << 3);
  *(byte *)((long)pIVar4 + uVar8 + 6) = (byte)up;
  as->cost[down] = 0;
  as->modset = as->modset | 1 << ((byte)down & 0x1f);
  bVar6 = (byte)up & 0x1f;
  as->freeset = (as->freeset | 1 << (down & 0x1f)) & ~(1 << (up & 0x1f));
  as->weakset = as->weakset & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
  emit_movrr(as,(IRIns *)((long)pIVar4 + uVar8),down,up);
  if (*(char *)((long)as->ir + uVar8 + 7) == '\0') {
    iVar2 = as->snapalloc;
    SVar3 = as->snapno;
    pjVar5 = as->J;
    (pjVar5->fold).ins.field_0.ot = 0x1400;
    (pjVar5->fold).ins.field_0.op1 = (IRRef1)uVar1;
    (pjVar5->fold).ins.field_0.op2 = (short)iVar2 + (short)SVar3;
    TVar7 = lj_ir_emit(as->J);
    uVar8 = (ulong)((TVar7 & 0xffff) << 3);
    *(byte *)((long)(as->J->cur).ir + uVar8 + 6) = (byte)down;
    *(undefined1 *)((long)(as->J->cur).ir + uVar8 + 7) = 0;
  }
  return;
}

Assistant:

static void ra_rename(ASMState *as, Reg down, Reg up)
{
  IRRef ref = regcost_ref(as->cost[up] = as->cost[down]);
  IRIns *ir = IR(ref);
  ir->r = (uint8_t)up;
  as->cost[down] = 0;
  lj_assertA((down < RID_MAX_GPR) == (up < RID_MAX_GPR),
	     "rename between GPR/FPR %d and %d", down, up);
  lj_assertA(!rset_test(as->freeset, down), "rename from free reg %d", down);
  lj_assertA(rset_test(as->freeset, up), "rename to non-free reg %d", up);
  ra_free(as, down);  /* 'down' is free ... */
  ra_modified(as, down);
  rset_clear(as->freeset, up);  /* ... and 'up' is now allocated. */
  ra_noweak(as, up);
  RA_DBGX((as, "rename    $f $r $r", regcost_ref(as->cost[up]), down, up));
  emit_movrr(as, ir, down, up);  /* Backwards codegen needs inverse move. */
  if (!ra_hasspill(IR(ref)->s)) {  /* Add the rename to the IR. */
    /*
    ** The rename is effective at the subsequent (already emitted) exit
    ** branch. This is for the current snapshot (as->snapno). Except if we
    ** haven't yet allocated any refs for the snapshot (as->snapalloc == 1),
    ** then it belongs to the next snapshot.
    ** See also the discussion at asm_snap_checkrename().
    */
    ra_addrename(as, down, ref, as->snapno + as->snapalloc);
  }
}